

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void finalize_regressor(vw *all,string *reg_name)

{
  long lVar1;
  string *in_RSI;
  long in_RDI;
  undefined1 in_stack_00000207;
  string *in_stack_00000208;
  vw *in_stack_00000210;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [40];
  long local_8;
  
  if ((*(byte *)(in_RDI + 0x3458) & 1) == 0) {
    local_8 = in_RDI;
    lVar1 = std::__cxx11::string::length();
    if (lVar1 == 0) {
      std::__cxx11::string::string(local_60,in_RSI);
      dump_regressor(in_stack_00000210,in_stack_00000208,(bool)in_stack_00000207);
      std::__cxx11::string::~string(local_60);
    }
    else {
      std::__cxx11::string::string(local_30,(string *)(local_8 + 0x2e8));
      dump_regressor(in_stack_00000210,in_stack_00000208,(bool)in_stack_00000207);
      std::__cxx11::string::~string(local_30);
    }
    lVar1 = std::__cxx11::string::length();
    if (lVar1 == 0) {
      std::__cxx11::string::string(local_a0,(string *)(local_8 + 0x3480));
      dump_regressor(in_stack_00000210,in_stack_00000208,(bool)in_stack_00000207);
      std::__cxx11::string::~string(local_a0);
      *(undefined1 *)(local_8 + 0x3619) = 1;
      std::__cxx11::string::string(local_c0,(string *)(local_8 + 0x34a0));
      dump_regressor(in_stack_00000210,in_stack_00000208,(bool)in_stack_00000207);
      std::__cxx11::string::~string(local_c0);
      *(undefined1 *)(local_8 + 0x3619) = 0;
    }
    else {
      std::__cxx11::string::string(local_80,(string *)(local_8 + 0x308));
      dump_regressor(in_stack_00000210,in_stack_00000208,(bool)in_stack_00000207);
      std::__cxx11::string::~string(local_80);
    }
  }
  return;
}

Assistant:

void finalize_regressor(vw& all, string reg_name)
{
  if (!all.early_terminate)
  {
    if (all.per_feature_regularizer_output.length() > 0)
      dump_regressor(all, all.per_feature_regularizer_output, false);
    else
      dump_regressor(all, reg_name, false);
    if (all.per_feature_regularizer_text.length() > 0)
      dump_regressor(all, all.per_feature_regularizer_text, true);
    else
    {
      dump_regressor(all, all.text_regressor_name, true);
      all.print_invert = true;
      dump_regressor(all, all.inv_hash_regressor_name, true);
      all.print_invert = false;
    }
  }
}